

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

UnlockStatus __thiscall CategoriesMutex::unlock(CategoriesMutex *this)

{
  int iVar1;
  UnlockStatus UVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->internal_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (this->count_ == 0) {
    UVar2 = ALREADY_UNLOCKED;
  }
  else {
    iVar1 = this->count_ + -1;
    this->count_ = iVar1;
    if (iVar1 == 0) {
      this->current_category_ = -1;
    }
    std::unique_lock<std::mutex>::unlock(&local_20);
    std::condition_variable::notify_all();
    UVar2 = UNLOCK_SUCCESS;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return UVar2;
}

Assistant:

UnlockStatus unlock() {
        std::unique_lock lock(internal_);
        if (count_ == 0) {
            return ALREADY_UNLOCKED;
        }
        --count_;
        if (count_ == 0) {
            current_category_ = -1;
        }

        lock.unlock();
        cv.notify_all();
        return UNLOCK_SUCCESS;
    }